

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O1

void absl::ascii_internal::AsciiStrCaseFold<false>
               (Nonnull<char_*> dst,Nonnull<const_char_*> src,size_t size)

{
  size_t sVar1;
  
  if (size < 0x10) {
    if (size != 0) {
      sVar1 = 0;
      do {
        dst[sVar1] = ((char)(src[sVar1] + 0x3fU) < -0x66) << 5 ^ src[sVar1];
        sVar1 = sVar1 + 1;
      } while (size != sVar1);
    }
    return;
  }
  if (0xf < size) {
    sVar1 = 0;
    do {
      dst[sVar1] = ((char)(src[sVar1] + 0x3fU) < -0x66) << 5 ^ src[sVar1];
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
    return;
  }
  __assert_fail("size >= kCaseFoldThreshold",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/ascii.cc"
                ,0xcd,
                "void absl::ascii_internal::AsciiStrCaseFoldLong(absl::Nonnull<char *>, absl::Nonnull<const char *>, size_t) [ToUpper = false]"
               );
}

Assistant:

constexpr void AsciiStrCaseFold(absl::Nonnull<char*> dst,
                                absl::Nonnull<const char*> src, size_t size) {
  size < kCaseFoldThreshold ? AsciiStrCaseFoldImpl<ToUpper>(dst, src, size)
                            : AsciiStrCaseFoldLong<ToUpper>(dst, src, size);
}